

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

vector<unsigned_int,_std::allocator<unsigned_int>_> * __thiscall
Gecko::Graph::node_neighbors
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,Graph *this,
          Index i)

{
  iterator __position;
  pointer pNVar1;
  value_type_conflict *__x;
  long lVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pNVar1 = (this->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (ulong)pNVar1[i - 1].arc;
  if (pNVar1[i - 1].arc < pNVar1[i].arc) {
    lVar2 = uVar3 * 4;
    do {
      __x = (value_type_conflict *)
            ((long)(this->adj).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar2);
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert
                  (__return_storage_ptr__,__position,__x);
        pNVar1 = (this->node).super__Vector_base<Gecko::Node,_std::allocator<Gecko::Node>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      else {
        *__position._M_current = *__x;
        (__return_storage_ptr__->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
        _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 4;
    } while (uVar3 < pNVar1[i].arc);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Node::Index>
Graph::node_neighbors(Node::Index i) const
{
  std::vector<Node::Index> neighbor;
  for (Arc::Index a = node_begin(i); a < node_end(i); a++)
    neighbor.push_back(adj[a]);
  return neighbor;
}